

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_construct.cpp
# Opt level: O2

void __thiscall tst_qpromise_construct::connectAndResolve(tst_qpromise_construct *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<std::shared_ptr<int>_>_> QVar2;
  bool bVar3;
  QObject *this_00;
  PromiseData<std::shared_ptr<int>_> *this_01;
  undefined4 *puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data> QVar5
  ;
  QObject *oldD;
  char *reject;
  undefined4 in_stack_fffffffffffffe9c;
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> local_150;
  QPromiseBase<void> local_140;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_130;
  QPromise<std::shared_ptr<int>_> p;
  PromiseResolver<void> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_110;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_108;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_100;
  PromiseResolver<std::shared_ptr<int>_> resolver;
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> local_d8;
  _Any_data local_c8;
  _Manager_type local_b8;
  _Invoker_type p_Stack_b0;
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> local_a8;
  weak_ptr<int> wptr;
  weak_ptr<int> *local_88;
  Data *local_80;
  Data *local_78;
  weak_ptr<int> *local_70;
  Data *local_68;
  Data *local_60;
  weak_ptr<int> *local_58;
  Data *local_50;
  Data *local_48;
  QObject local_40 [8];
  code *local_38;
  undefined8 local_30;
  
  this_00 = (QObject *)operator_new(0x10);
  QObject::QObject(this_00,(QObject *)0x0);
  wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p.super_QPromiseBase<std::shared_ptr<int>_>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_001218b8;
  this_01 = (PromiseData<std::shared_ptr<int>_> *)operator_new(0x68);
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  m_error.m_data._M_exception_object = (void *)0x0;
  (this_01->m_value).m_data.super___shared_ptr<std::shared_ptr<int>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  m_catchers.d.size = 0;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  m_handlers.d.size = 0;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  m_catchers.d.d = (Data *)0x0;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  m_handlers.d.d = (Data *)0x0;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  m_handlers.d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)
   &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
    m_lock = 0;
  *(undefined8 *)
   &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
    m_settled = 0;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  _vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
    super_QSharedData = 0;
  (this_01->m_value).m_data.super___shared_ptr<std::shared_ptr<int>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<std::shared_ptr<int>_>::PromiseData(this_01);
  LOCK();
  pQVar1 = &(this_01->
            super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
            super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_01 != (PromiseData<std::shared_ptr<int>_> *)0x0) {
    LOCK();
    pQVar1 = &(this_01->
              super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8._M_unused._M_object = &PTR__QPromiseBase_00121c00;
  p.super_QPromiseBase<std::shared_ptr<int>_>.m_d.d = this_01;
  local_c8._8_8_ = this_01;
  QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::PromiseResolver
            (&resolver,(QPromise<std::shared_ptr<int>_> *)&local_c8);
  QtPromise::QPromiseBase<std::shared_ptr<int>_>::~QPromiseBase
            ((QPromiseBase<std::shared_ptr<int>_> *)&local_c8);
  if (resolver.m_d.d == (Data *)0x0) {
    local_150._M_ptr = (element_type *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_150._M_ptr = (element_type *)resolver;
  }
  local_140._vptr_QPromiseBase = (_func_int **)0x0;
  if ((Data *)local_150._M_ptr == (Data *)0x0) {
    local_a8._M_ptr = (element_type *)0x0;
  }
  else {
    LOCK();
    (((Data *)local_150._M_ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_150._M_ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_a8._M_ptr = local_150._M_ptr;
  }
  local_d8._M_ptr = (element_type *)0x0;
  local_88 = &wptr;
  if ((Data *)local_150._M_ptr != (Data *)0x0) {
    LOCK();
    (((Data *)local_150._M_ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_150._M_ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((Data *)local_a8._M_ptr != (Data *)0x0) {
    LOCK();
    (((Data *)local_a8._M_ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_a8._M_ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((Data *)local_150._M_ptr != (Data *)0x0) {
    LOCK();
    (((Data *)local_150._M_ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_150._M_ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((Data *)local_a8._M_ptr != (Data *)0x0) {
    LOCK();
    (((Data *)local_a8._M_ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_a8._M_ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38 = QObject::objectNameChanged;
  local_30 = 0;
  local_80 = (Data *)local_150._M_ptr;
  local_78 = (Data *)local_a8._M_ptr;
  local_70 = local_88;
  local_68 = (Data *)local_150._M_ptr;
  local_60 = (Data *)local_a8._M_ptr;
  puVar4 = (undefined4 *)operator_new(0x28);
  local_58 = local_70;
  local_50 = local_68;
  if (local_68 != (Data *)0x0) {
    LOCK();
    (local_68->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_68->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48 = local_60;
  if (local_60 != (Data *)0x0) {
    LOCK();
    (local_60->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_60->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_construct.cpp:288:25),_1,_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(weak_ptr<int> **)(puVar4 + 4) = local_70;
  *(Data **)(puVar4 + 6) = local_68;
  if (local_68 != (Data *)0x0) {
    LOCK();
    (local_68->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_68->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)(puVar4 + 8) = local_60;
  if (local_60 != (Data *)0x0) {
    LOCK();
    (local_60->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_60->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QObject::connectImpl
            (local_40,(void **)this_00,(QObject *)&local_38,(void **)this_00,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar4,(int *)CONCAT44(in_stack_fffffffffffffe9c,1),(QMetaObject *)0x0)
  ;
  const::{lambda(QString_const&)#1}::~QString((_lambda_QString_const___1_ *)&local_58);
  const::{lambda(QString_const&)#1}::~QString((_lambda_QString_const___1_ *)&local_70);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  const::{lambda(QString_const&)#1}::~QString((_lambda_QString_const___1_ *)&local_88);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data>
              *)&local_a8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data>
              *)&local_d8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data>
              *)&local_150);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data>
              *)&local_140);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  p.super_QPromiseBase<std::shared_ptr<int>_>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_00121c00;
  bVar3 = QtPromisePrivate::
          PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>::isPending
                    (&(p.super_QPromiseBase<std::shared_ptr<int>_>.m_d.d)->
                      super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>
                    );
  local_c8._M_pod_data[0] = bVar3;
  resolver.m_d.d._0_1_ = 1;
  reject = 
  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_construct.cpp"
  ;
  bVar3 = QTest::qCompare<bool,bool>
                    ((bool *)local_c8._M_pod_data,(bool *)&resolver,"p.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_construct.cpp"
                     ,0x12d);
  if (bVar3) {
    QString::QString((QString *)&local_c8,"foobar");
    QObject::setObjectName((QString *)this_00);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
    local_d8._M_ptr = (element_type *)0x0;
    local_d8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_a8,&local_d8);
    local_140._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00121888;
    this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
    this_02[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(qsizetype *)&this_02[4]._M_use_count = 0;
    this_02[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    this_02[3]._M_use_count = 0;
    this_02[3]._M_weak_count = 0;
    ((DataPointer *)&this_02[2]._vptr__Sp_counted_base)->d = (Data *)0x0;
    *(pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> **)&this_02[2]._M_use_count =
         (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
    this_02[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(undefined8 *)&this_02[1]._M_use_count = 0;
    ((PromiseDataBase<void,_void_()> *)&this_02->_vptr__Sp_counted_base)->_vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)&this_02->_M_use_count = 0;
    ((exception_ptr *)&this_02[5]._vptr__Sp_counted_base)->_M_exception_object = (void *)0x0;
    QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)this_02);
    LOCK();
    (((QSharedData *)&this_02->_M_use_count)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&this_02->_M_use_count)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      LOCK();
      (((QSharedData *)&this_02->_M_use_count)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((QSharedData *)&this_02->_M_use_count)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_150._M_ptr = (element_type *)&PTR__QPromiseBase_00121a68;
    local_150._M_refcount._M_pi = this_02;
    local_140.m_d.d = (PromiseData<void> *)this_02;
    QtPromisePrivate::PromiseResolver<void>::PromiseResolver
              (&resolver_1,(QPromise<void> *)&local_150);
    QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_150);
    QVar2 = p.super_QPromiseBase<std::shared_ptr<int>_>.m_d;
    if (resolver_1.m_d.d == (Data *)0x0) {
      resolver_1.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
    }
    else {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
    }
    local_100.d = (Data *)0x0;
    if (resolver_1.m_d.d == (Data *)0x0) {
      QVar5.d = (Data *)0x0;
    }
    else {
      LOCK();
      (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar5.d = (Data *)resolver_1.m_d.d;
    }
    local_110.d = (Data *)0x0;
    if (resolver_1.m_d.d != (Data *)0x0) {
      LOCK();
      (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (QVar5.d != (Data *)0x0) {
      LOCK();
      ((QVar5.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           ((QVar5.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c8._M_unused._M_object = (Data *)0x0;
    local_c8._8_8_ = (PromiseData<std::shared_ptr<int>_> *)0x0;
    local_b8 = (_Manager_type)0x0;
    p_Stack_b0 = (_Invoker_type)0x0;
    local_130 = resolver_1.m_d.d;
    local_108.d = (Data *)QVar5.d;
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data>
          )(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data>
            )resolver_1.m_d.d;
    local_c8._M_unused._M_object = operator_new(0x18);
    *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data> *
     )&((Data *)local_c8._M_unused._0_8_)->super_QArrayData = resolver.m_d.d;
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
    }
    *(Data **)((long)&((Data *)local_c8._M_unused._0_8_)->super_QArrayData + 8) = QVar5.d;
    if (QVar5.d != (Data *)0x0) {
      LOCK();
      ((QVar5.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           ((QVar5.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    *(Data **)&((Data *)((long)local_c8._M_unused._0_8_ + 0x10))->super_QArrayData =
         (Data *)&local_a8;
    p_Stack_b0 = std::
                 _Function_handler<void_(const_std::shared_ptr<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_b8 = std::
               _Function_handler<void_(const_std::shared_ptr<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
    QtPromisePrivate::
    PromiseHandler<std::shared_ptr<int>,waitForValue<std::shared_ptr<int>>(QtPromise::QPromise<std::shared_ptr<int>>const&,std::shared_ptr<int>const&)::{lambda(std::shared_ptr<int>const&)#1}(std::shared_ptr<int>const&)#1},std::shared_ptr<int>const&>
    ::
    create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(waitForValue<std::shared_ptr<int>>(QtPromise::QPromise<std::shared_ptr<int>>const&,std::shared_ptr<int>const&)::{lambda(std::shared_ptr<int>const&)#1}(std::shared_ptr<int>const&)#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
    ::{lambda(std::shared_ptr<int>const&)#1}::~function
              ((_lambda_std__shared_ptr<int>const___1_ *)&resolver);
    QtPromisePrivate::PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>::
    addHandler(&(QVar2.d)->
                super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>,
               (function<void_(const_std::shared_ptr<int>_&)> *)&local_c8);
    std::_Function_base::~_Function_base((_Function_base *)&local_c8);
    QVar2 = p.super_QPromiseBase<std::shared_ptr<int>_>.m_d;
    QtPromisePrivate::PromiseCatcher<std::shared_ptr<int>,decltype(nullptr),void>::
    create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
              ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver,
               (PromiseCatcher<std::shared_ptr<int>,decltype(nullptr),void> *)0x0,&local_130,
               (QPromiseResolve<void> *)&local_108,(QPromiseReject<void> *)reject);
    QtPromisePrivate::PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>::
    addCatcher(&(QVar2.d)->
                super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>,
               (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
    std::_Function_base::~_Function_base((_Function_base *)&resolver);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
    ~QExplicitlySharedDataPointer(&local_108);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
    ~QExplicitlySharedDataPointer(&local_110);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
    ~QExplicitlySharedDataPointer(&local_130);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
    ~QExplicitlySharedDataPointer(&local_100);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
    ~QExplicitlySharedDataPointer(&resolver_1.m_d);
    local_140._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00121a68;
    bVar3 = QtPromisePrivate::
            PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>::isPending
                      (&(p.super_QPromiseBase<std::shared_ptr<int>_>.m_d.d)->
                        super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>
                      );
    if (!bVar3) {
      QtPromisePrivate::PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>::
      dispatch(&(p.super_QPromiseBase<std::shared_ptr<int>_>.m_d.d)->
                super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>);
    }
    QtPromise::QPromiseBase<void>::wait((QPromiseBase<void> *)&local_150,&local_140);
    QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_150);
    QtPromise::QPromiseBase<void>::~QPromiseBase(&local_140);
    std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_150,&wptr);
    bVar3 = QTest::qCompare<std::shared_ptr<int>,std::shared_ptr<int>>
                      ((shared_ptr<int> *)&local_a8,(shared_ptr<int> *)&local_150,
                       "waitForValue(p, std::shared_ptr<int>{})","wptr.lock()",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_construct.cpp"
                       ,0x131);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
    if (bVar3) {
      if (wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_150._M_ptr = (element_type *)0x0;
      }
      else {
        local_150._M_ptr =
             (element_type *)
             (long)(wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                   _M_use_count;
      }
      local_140._vptr_QPromiseBase = (_func_int **)0x1;
      bVar3 = QTest::qCompare<long,long>
                        ((long *)&local_150,(long *)&local_140,"wptr.use_count()","1l",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_construct.cpp"
                         ,0x132);
      QtPromise::QPromiseBase<std::shared_ptr<int>_>::~QPromiseBase
                (&p.super_QPromiseBase<std::shared_ptr<int>_>);
      if (bVar3) {
        if (wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_150._M_ptr = (element_type *)0x0;
        }
        else {
          local_150._M_ptr =
               (element_type *)
               (long)(wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                     _M_use_count;
        }
        local_140._vptr_QPromiseBase = (_func_int **)0x0;
        QTest::qCompare<long,long>
                  ((long *)&local_150,(long *)&local_140,"wptr.use_count()","0l",
                   "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_construct.cpp"
                   ,0x135);
      }
      goto LAB_00109be6;
    }
  }
  QtPromise::QPromiseBase<std::shared_ptr<int>_>::~QPromiseBase
            (&p.super_QPromiseBase<std::shared_ptr<int>_>);
LAB_00109be6:
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (**(code **)(*(long *)this_00 + 0x20))(this_00);
  return;
}

Assistant:

void tst_qpromise_construct::connectAndResolve()
{
    QScopedPointer<QObject> object(new QObject{});

    std::weak_ptr<int> wptr;

    {
        auto p = QtPromise::QPromise<std::shared_ptr<int>>{
            [&](const QtPromise::QPromiseResolve<std::shared_ptr<int>>& resolve,
                const QtPromise::QPromiseReject<std::shared_ptr<int>>& reject) {
                connect(object.data(),
                        &QObject::objectNameChanged,
                        [=, &wptr](const QString& name) {
                            auto sptr = std::make_shared<int>(42);

                            wptr = sptr;

                            if (name == "foobar") {
                                resolve(sptr);
                            } else {
                                reject(42);
                            }
                        });
            }};

        QCOMPARE(p.isPending(), true);

        object->setObjectName("foobar");

        QCOMPARE(waitForValue(p, std::shared_ptr<int>{}), wptr.lock());
        QCOMPARE(wptr.use_count(), 1l); // "p" still holds a reference
    }

    QCOMPARE(wptr.use_count(), 0l);
}